

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

us_internal_ssl_socket_context_t *
us_internal_create_child_ssl_socket_context
          (us_internal_ssl_socket_context_t *context,int context_ext_size)

{
  us_internal_ssl_socket_context_t *puVar1;
  us_socket_context_options_t options;
  
  puVar1 = (us_internal_ssl_socket_context_t *)
           us_create_socket_context
                     (0,(context->sc).loop,context_ext_size + 0xc0,
                      (us_socket_context_options_t)ZEXT1648(ZEXT816(0)));
  puVar1->ssl_context = context->ssl_context;
  puVar1->is_parent = 0;
  return puVar1;
}

Assistant:

struct us_internal_ssl_socket_context_t *us_internal_create_child_ssl_socket_context(struct us_internal_ssl_socket_context_t *context, int context_ext_size) {
    struct us_socket_context_options_t options = {0};

    struct us_internal_ssl_socket_context_t *child_context = (struct us_internal_ssl_socket_context_t *) us_create_socket_context(0, context->sc.loop, sizeof(struct us_internal_ssl_socket_context_t) + context_ext_size, options);

    // I think this is the only thing being shared
    child_context->ssl_context = context->ssl_context;
    child_context->is_parent = 0;

    return child_context;
}